

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

bool __thiscall
duckdb::CollectionScanState::ScanCommitted
          (CollectionScanState *this,DataChunk *result,TableScanType type)

{
  RowGroup *pRVar1;
  
  while (pRVar1 = this->row_group, pRVar1 != (RowGroup *)0x0) {
    RowGroup::ScanCommitted(pRVar1,this,result,type);
    if (result->count != 0) break;
    pRVar1 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                       (&this->row_groups->super_SegmentTree<duckdb::RowGroup,_true>,this->row_group
                       );
    this->row_group = pRVar1;
    if (pRVar1 != (RowGroup *)0x0) {
      RowGroup::InitializeScan(pRVar1,this);
    }
  }
  return pRVar1 != (RowGroup *)0x0;
}

Assistant:

bool CollectionScanState::ScanCommitted(DataChunk &result, TableScanType type) {
	while (row_group) {
		row_group->ScanCommitted(*this, result, type);
		if (result.size() > 0) {
			return true;
		} else {
			row_group = row_groups->GetNextSegment(row_group);
			if (row_group) {
				row_group->InitializeScan(*this);
			}
		}
	}
	return false;
}